

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidatePrimitiveShadingRateAtDefinition
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst)

{
  ValidationState_t *this_00;
  Instruction *inst_00;
  Instruction *decoration_00;
  bool bVar1;
  uint32_t id;
  spv_result_t sVar2;
  spv_const_context psVar3;
  DiagnosticStream *pDVar4;
  string local_260;
  DiagnosticStream local_240;
  anon_class_24_3_17f1b8ef local_68;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  spv_result_t local_2c;
  Instruction *pIStack_28;
  spv_result_t error;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  pIStack_28 = inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  psVar3 = ValidationState_t::context(this->_);
  bVar1 = spvIsVulkanEnv(psVar3->target_env);
  decoration_00 = inst_local;
  inst_00 = pIStack_28;
  if (bVar1) {
    local_68.inst = pIStack_28;
    local_68.decoration = (Decoration *)inst_local;
    local_68.this = this;
    std::function<spv_result_t(std::__cxx11::string_const&)>::
    function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidatePrimitiveShadingRateAtDefinition(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&)::__0,void>
              ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_50,&local_68);
    sVar2 = ValidateI32(this,(Decoration *)decoration_00,inst_00,&local_50);
    std::
    function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_50);
    if (sVar2 != SPV_SUCCESS) {
      return sVar2;
    }
    local_2c = sVar2;
    bVar1 = isMeshInterfaceVar(this,pIStack_28);
    if ((bVar1) &&
       (bVar1 = ValidationState_t::HasCapability(this->_,CapabilityMeshShadingEXT), bVar1)) {
      this_00 = this->_;
      id = val::Instruction::id(pIStack_28);
      bVar1 = ValidationState_t::HasDecoration(this_00,id,DecorationPerPrimitiveEXT);
      if (!bVar1) {
        ValidationState_t::diag(&local_240,this->_,SPV_ERROR_INVALID_DATA,pIStack_28);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_260,this->_,0x1b93,(char *)0x0);
        pDVar4 = DiagnosticStream::operator<<(&local_240,&local_260);
        pDVar4 = DiagnosticStream::operator<<
                           (pDVar4,(char (*) [146])
                                   "The variable decorated with PrimitiveShadingRateKHR within the MeshEXT Execution Model must also be decorated with the PerPrimitiveEXT decoration"
                           );
        this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        std::__cxx11::string::~string((string *)&local_260);
        DiagnosticStream::~DiagnosticStream(&local_240);
        return this_local._4_4_;
      }
    }
  }
  sVar2 = ValidatePrimitiveShadingRateAtReference
                    (this,(Decoration *)inst_local,pIStack_28,pIStack_28,pIStack_28);
  return sVar2;
}

Assistant:

spv_result_t BuiltInsValidator::ValidatePrimitiveShadingRateAtDefinition(
    const Decoration& decoration, const Instruction& inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (spv_result_t error = ValidateI32(
            decoration, inst,
            [this, &inst,
             &decoration](const std::string& message) -> spv_result_t {
              return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                     << _.VkErrorID(4486)
                     << "According to the Vulkan spec BuiltIn "
                     << _.grammar().lookupOperandName(
                            SPV_OPERAND_TYPE_BUILT_IN,
                            (uint32_t)decoration.builtin())
                     << " variable needs to be a 32-bit int scalar. "
                     << message;
            })) {
      return error;
    }
    if (isMeshInterfaceVar(inst) &&
        _.HasCapability(spv::Capability::MeshShadingEXT) &&
        !_.HasDecoration(inst.id(), spv::Decoration::PerPrimitiveEXT)) {
      return _.diag(SPV_ERROR_INVALID_DATA, &inst)
             << _.VkErrorID(7059)
             << "The variable decorated with PrimitiveShadingRateKHR "
                "within the MeshEXT Execution Model must also be "
                "decorated with the PerPrimitiveEXT decoration";
    }
  }

  // Seed at reference checks with this built-in.
  return ValidatePrimitiveShadingRateAtReference(decoration, inst, inst, inst);
}